

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int arena_i_initialized_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  _Bool _Var1;
  int iVar2;
  ctl_arena_t *pcVar3;
  size_t copylen;
  ulong uVar4;
  undefined1 local_29;
  
  iVar2 = 1;
  if (newp == (void *)0x0 && newlen == 0) {
    uVar4 = mib[1];
    iVar2 = 0xe;
    if (uVar4 >> 0x20 == 0) {
      iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
      if (iVar2 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
        ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
      }
      ctl_mtx.field_0.field_0.prof_data.n_lock_ops =
           ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
      if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        ctl_mtx.field_0.witness.link.qre_prev =
             (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
        ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
      }
      pcVar3 = arenas_i(uVar4);
      _Var1 = pcVar3->initialized;
      ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
      local_29 = _Var1;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
      iVar2 = 0;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        if (*oldlenp == 1) {
          *(_Bool *)oldp = _Var1;
        }
        else {
          uVar4 = (ulong)(*oldlenp != 0);
          switchD_012bc561::default(oldp,&local_29,uVar4);
          *oldlenp = uVar4;
          iVar2 = 0x16;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
arena_i_initialized_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	tsdn_t *tsdn = tsd_tsdn(tsd);
	unsigned arena_ind;
	bool initialized;

	READONLY();
	MIB_UNSIGNED(arena_ind, 1);

	malloc_mutex_lock(tsdn, &ctl_mtx);
	initialized = arenas_i(arena_ind)->initialized;
	malloc_mutex_unlock(tsdn, &ctl_mtx);

	READ(initialized, bool);

	ret = 0;
label_return:
	return ret;
}